

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O2

void __thiscall
estl::vector_s<Rect,6ul>::shift_right<Rect*>
          (vector_s<Rect,6ul> *this,Rect *first,Rect *last,size_type n)

{
  size_type i;
  size_type sVar1;
  
  if (-1 < (long)last - (long)first) {
    for (sVar1 = 0; n != sVar1; sVar1 = sVar1 + 1) {
      last[sVar1].width_ = 0;
      last[sVar1].height_ = 0;
    }
    for (; last != first; last = last + -1) {
      last[n - 1] = last[-1];
    }
  }
  return;
}

Assistant:

void shift_right(InputIt first, InputIt last, size_type n)
    {
        const long diff_signed = last - first;
        if (diff_signed < 0) {
            return;
        }

        // Make room for elements
        for (size_type i = 0; i < n; ++i) {
            const pointer insert_ptr = last + i;
            new (insert_ptr) value_type(); // Default contruct the extra elements needed. Could perhaps construct when first needed instead!
        }

        for (InputIt it = last; it != first;) {
            --it;
            *(it+n) = std::move(*it);
        }
    }